

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

void __thiscall AActor::ConversationAnimation(AActor *this,int animnum)

{
  FState *newstate;
  FName *label;
  FName local_14;
  FName local_10;
  FName local_c;
  
  if (animnum == 2) {
    label = &local_14;
    local_14.Index = 0x92;
  }
  else if (animnum == 1) {
    label = &local_10;
    local_10.Index = 0x91;
  }
  else {
    if (animnum != 0) {
      return;
    }
    label = &local_c;
    local_c.Index = 0x93;
  }
  newstate = FindState(this,label);
  if (newstate != (FState *)0x0) {
    SetState(this,newstate,false);
  }
  return;
}

Assistant:

void AActor::ConversationAnimation (int animnum)
{
	FState * state = NULL;
	switch (animnum)
	{
	case 0:
		state = FindState(NAME_Greetings);
		break;
	case 1:
		state = FindState(NAME_Yes);
		break;
	case 2:
		state = FindState(NAME_No);
		break;
	}
	if (state != NULL) SetState(state);
}